

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

int __thiscall pstore::file::deleter_base::unlink(deleter_base *this,char *__name)

{
  int in_EAX;
  
  if (this->released_ == false) {
    if ((this->unlinker_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    in_EAX = (*(this->unlinker_)._M_invoker)((_Any_data *)&this->unlinker_,&this->path_);
    this->released_ = true;
  }
  return in_EAX;
}

Assistant:

void deleter_base::unlink () {
            if (!released_) {
                unlinker_ (path_);
                released_ = true;
            }
        }